

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_object.cpp
# Opt level: O3

void mjs::anon_unknown_35::anon_unknown_5::throw_uri_error(gc_heap_ptr<mjs::global_object> *global)

{
  native_error_exception *this;
  void *pvVar1;
  wchar_t *local_58;
  size_t local_50;
  wstring_view local_38;
  wstring_view local_28;
  
  this = (native_error_exception *)__cxa_allocate_exception(0x58);
  pvVar1 = gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  if (*(long *)((long)pvVar1 + 0x40) == 0) {
    __assert_fail("stack_trace_",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/global_object.h"
                  ,0x2a,"std::wstring mjs::global_object::stack_trace() const");
  }
  (**(code **)((long)pvVar1 + 0x48))(&local_58,(long)pvVar1 + 0x30);
  local_28._M_len = local_50;
  local_28._M_str = local_58;
  local_38._M_len = 0xd;
  local_38._M_str = L"URI malformed";
  native_error_exception::native_error_exception(this,uri,&local_28,&local_38);
  __cxa_throw(this,&native_error_exception::typeinfo,native_error_exception::~native_error_exception
             );
}

Assistant:

[[noreturn]] void throw_uri_error(const gc_heap_ptr<global_object>& global) {
    throw native_error_exception{native_error_type::uri, global->stack_trace(), L"URI malformed"};
}